

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O0

double mpe(double *predicted,double *actual,int N)

{
  double *err_00;
  int local_40;
  int local_3c;
  int j;
  int i;
  double *errvec;
  double temp;
  double err;
  int N_local;
  double *actual_local;
  double *predicted_local;
  
  err_00 = (double *)malloc((long)N << 3);
  pe(predicted,actual,N,err_00);
  local_40 = 0;
  errvec = (double *)0x0;
  for (local_3c = 0; local_3c < N; local_3c = local_3c + 1) {
    if ((err_00[local_3c] == err_00[local_3c]) && (!NAN(err_00[local_3c]) && !NAN(err_00[local_3c]))
       ) {
      local_40 = local_40 + 1;
      errvec = (double *)(err_00[local_3c] + (double)errvec);
    }
  }
  free(err_00);
  return (double)errvec / (double)local_40;
}

Assistant:

double mpe(double *predicted, double *actual, int N) {
    double err,temp;
    double *errvec;
    int i,j;

    errvec = (double*) malloc(sizeof(double)*N);

    pe(predicted,actual,N,errvec);
    j = 0;
    temp = 0.0;
    for(i = 0; i < N;++i) {
        if (errvec[i] == errvec[i]) {
            j++;
            temp += errvec[i];
        }
    }

    err = temp/j;

    free(errvec);
    return err;
}